

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingSphereRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::BoundingSphereRecord::Encode(BoundingSphereRecord *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  BoundingSphereRecord *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui16Length);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Index);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_CentLocation).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32Rad);
  KDataStream::operator<<(pKVar1,this->m_ui32Padding);
  return;
}

Assistant:

void BoundingSphereRecord::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CentLocation
           << m_f32Rad
           << m_ui32Padding;
}